

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O0

void PostCreateInt(ebml_element *Element,bool_t SetDefault,int ForProfile)

{
  void *pvVar1;
  int ForProfile_local;
  bool_t SetDefault_local;
  ebml_element *Element_local;
  
  pvVar1 = Node_InheritedVMT((node *)Element,0x54494245);
  (**(code **)((long)pvVar1 + 0xb8))(Element,SetDefault,ForProfile);
  Element->DefaultSize = 1;
  if ((SetDefault != 0) && (Element->Context->HasDefault != 0)) {
    EBML_IntegerSetValue((ebml_integer *)Element,Element->Context->DefaultValue);
  }
  return;
}

Assistant:

static void PostCreateInt(ebml_element *Element, bool_t SetDefault, int ForProfile)
{
    INHERITED(Element,ebml_element_vmt,EBML_INTEGER_CLASS)->PostCreate(Element, SetDefault, ForProfile);
    Element->DefaultSize = 1;
    if (SetDefault && Element->Context->HasDefault)
        EBML_IntegerSetValue((ebml_integer*)Element, Element->Context->DefaultValue);
}